

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O3

char * skynet_command(skynet_context *context,char *cmd,char *param)

{
  int iVar1;
  char *pcVar2;
  command_func *pcVar3;
  
  pcVar2 = "TIMEOUT";
  pcVar3 = cmd_funcs;
  do {
    pcVar3 = pcVar3 + 1;
    iVar1 = strcmp(cmd,pcVar2);
    if (iVar1 == 0) {
      pcVar2 = (*pcVar3[-1].func)(context,param);
      return pcVar2;
    }
    pcVar2 = pcVar3->name;
  } while (pcVar2 != (char *)0x0);
  return (char *)0x0;
}

Assistant:

const char * 
skynet_command(struct skynet_context * context, const char * cmd , const char * param) {
	struct command_func * method = &cmd_funcs[0];
	while(method->name) {
		if (strcmp(cmd, method->name) == 0) {
			return method->func(context, param);
		}
		++method;
	}

	return NULL;
}